

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_selection_bvec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[2].m_data[2];
  if (0.0 < fVar1) {
    fVar2 = c->in[1].m_data[1];
  }
  fVar3 = c->in[2].m_data[1];
  if (0.0 < fVar1) {
    fVar3 = c->in[1].m_data[0];
  }
  (c->color).m_data[1] = (float)(0.0 < fVar2);
  (c->color).m_data[2] = (float)(0.0 < fVar3);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }